

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O1

int __thiscall
libtorrent::aux::session_impl::copy_pertinent_channels
          (session_impl *this,peer_class_set *set,int channel,bandwidth_channel **dst,int max)

{
  char cVar1;
  peer_class *ppVar2;
  long lVar3;
  int iVar4;
  bool bVar5;
  
  cVar1 = set->m_size;
  if ((long)cVar1 < 1) {
    iVar4 = 0;
  }
  else {
    lVar3 = 0;
    iVar4 = 0;
    do {
      ppVar2 = peer_class_pool::at(&this->m_classes,
                                   (peer_class_t)
                                   (set->m_class).
                                   super_array<libtorrent::aux::strong_typedef<unsigned_int,_libtorrent::peer_class_tag,_void>,_15UL>
                                   ._M_elems[lVar3].m_val);
      bVar5 = false;
      if ((ppVar2 != (peer_class *)0x0) &&
         ((&ppVar2->priority)[(long)channel * 3 + -5]._M_elems[0] != 0)) {
        dst[iVar4] = (bandwidth_channel *)(&ppVar2->priority + (long)channel * 3 + -7);
        iVar4 = iVar4 + 1;
        bVar5 = iVar4 == max;
      }
    } while ((!bVar5) && (lVar3 = lVar3 + 1, cVar1 != lVar3));
  }
  return iVar4;
}

Assistant:

int session_impl::copy_pertinent_channels(peer_class_set const& set
		, int channel, bandwidth_channel** dst, int const max)
	{
		int num_channels = set.num_classes();
		int num_copied = 0;
		for (int i = 0; i < num_channels; ++i)
		{
			peer_class* pc = m_classes.at(set.class_at(i));
			TORRENT_ASSERT(pc);
			if (pc == nullptr) continue;
			bandwidth_channel* chan = &pc->channel[channel];
			// no need to include channels that don't have any bandwidth limits
			if (chan->throttle() == 0) continue;
			dst[num_copied] = chan;
			++num_copied;
			if (num_copied == max) break;
		}
		return num_copied;
	}